

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::formatTruncated<long>(ostream *out,long *value,int ntrunc)

{
  string result;
  ostringstream tmp;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<long>((long)local_198);
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)out,(long)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}